

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void AdditionHelper<char,_short,_5>::
     AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (char *lhs,short *rhs,char *result)

{
  char cVar1;
  int iVar2;
  undefined1 *in_RDX;
  short *in_RSI;
  char *in_RDI;
  int32_t tmp;
  
  iVar2 = (int)*in_RDI + (int)*in_RSI;
  cVar1 = std::numeric_limits<char>::max();
  if (iVar2 <= cVar1) {
    cVar1 = std::numeric_limits<char>::min();
    if (cVar1 <= iVar2) {
      *in_RDX = (char)iVar2;
      return;
    }
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // 16-bit or less - one or both are signed
        std::int32_t tmp = lhs + rhs;

        if( tmp <= (std::int32_t)std::numeric_limits<T>::max() && tmp >= (std::int32_t)std::numeric_limits<T>::min() )
        {
            result = (T)tmp;
            return;
        }

        E::SafeIntOnOverflow();
    }